

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

void __thiscall printable_vtable::printable_vtable<hi_printable>(printable_vtable *this)

{
  printable_vtable *this_local;
  
  (this->vtable_)._M_elems[0] = clone_impl<hi_printable>;
  (this->vtable_)._M_elems[1] = delete_impl<hi_printable>;
  (this->vtable_)._M_elems[2] = print_wrapper<hi_printable>::exec;
  this->get_value_ptr_ = get_value_ptr<false>;
  this->value_ = (void *)0x0;
  return;
}

Assistant:

printable_vtable (T value) :
        vtable_ ({
            (void_function_type)(&clone_impl<T>),
            (void_function_type)(&delete_impl<T>),
            (void_function_type)(&print_wrapper<T>::exec)
        }),
        get_value_ptr_ (&get_value_ptr<sizeof(value_) < sizeof(T)>),
        value_ (0)
    {
        if (sizeof(T) <= sizeof(value_))
            new (&value_) T(std::move(value));
        else
            value_ = new T(std::move(value));
    }